

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void ypr_encode(ly_out *out,char *text,ssize_t len)

{
  int iVar1;
  char local_39;
  char *pcStack_38;
  char special;
  char *start;
  size_t start_len;
  size_t i;
  ssize_t len_local;
  char *text_local;
  ly_out *out_local;
  
  local_39 = '\0';
  if (len != 0) {
    i = len;
    if (len < 0) {
      i = strlen(text);
    }
    start = (char *)0x0;
    pcStack_38 = text;
    for (start_len = 0; start_len < i; start_len = start_len + 1) {
      iVar1 = (int)text[start_len];
      if (((iVar1 - 9U < 2) || (iVar1 == 0x22)) || (iVar1 == 0x5c)) {
        local_39 = text[start_len];
      }
      else {
        start = start + 1;
      }
      if (local_39 != '\0') {
        ly_write_(out,pcStack_38,(size_t)start);
        if (local_39 == '\t') {
          ly_write_(out,"\\t",2);
        }
        else if (local_39 == '\n') {
          ly_write_(out,"\\n",2);
        }
        else if (local_39 == '\"') {
          ly_write_(out,"\\\"",2);
        }
        else if (local_39 == '\\') {
          ly_write_(out,"\\\\",2);
        }
        pcStack_38 = start + 1 + (long)pcStack_38;
        start = (char *)0x0;
        local_39 = '\0';
      }
    }
    ly_write_(out,pcStack_38,(size_t)start);
  }
  return;
}

Assistant:

static void
ypr_encode(struct ly_out *out, const char *text, ssize_t len)
{
    size_t i, start_len;
    const char *start;
    char special = 0;

    if (!len) {
        return;
    }

    if (len < 0) {
        len = strlen(text);
    }

    start = text;
    start_len = 0;
    for (i = 0; i < (size_t)len; ++i) {
        switch (text[i]) {
        case '\n':
        case '\t':
        case '\"':
        case '\\':
            special = text[i];
            break;
        default:
            ++start_len;
            break;
        }

        if (special) {
            ly_write_(out, start, start_len);
            switch (special) {
            case '\n':
                ly_write_(out, "\\n", 2);
                break;
            case '\t':
                ly_write_(out, "\\t", 2);
                break;
            case '\"':
                ly_write_(out, "\\\"", 2);
                break;
            case '\\':
                ly_write_(out, "\\\\", 2);
                break;
            }

            start += start_len + 1;
            start_len = 0;

            special = 0;
        }
    }

    ly_write_(out, start, start_len);
}